

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

void __thiscall
pbrt::CameraTransform::CameraTransform(CameraTransform *this,AnimatedTransform *worldFromCamera)

{
  undefined8 uVar1;
  int iVar2;
  Point3<float> *in_RSI;
  Transform *in_RDI;
  undefined1 auVar4 [56];
  undefined1 auVar3 [64];
  Point3f PVar5;
  Transform rfc [2];
  Transform renderFromWorld;
  Point3f pCamera;
  Float tMid_1;
  Float tMid;
  float in_stack_fffffffffffff9c8;
  float in_stack_fffffffffffff9cc;
  Transform *in_stack_fffffffffffff9d0;
  undefined1 local_610 [104];
  Transform *in_stack_fffffffffffffa58;
  Transform *in_stack_fffffffffffffa60;
  char *in_stack_fffffffffffffa68;
  int in_stack_fffffffffffffa74;
  char *in_stack_fffffffffffffa78;
  LogLevel in_stack_fffffffffffffa84;
  undefined4 in_stack_fffffffffffffa90;
  Float in_stack_fffffffffffffa94;
  Point3f *in_stack_fffffffffffffa98;
  AnimatedTransform *in_stack_fffffffffffffaa0;
  Float in_stack_fffffffffffffd0c;
  AnimatedTransform *in_stack_fffffffffffffd10;
  undefined1 local_1cc [140];
  undefined1 local_140 [116];
  Float in_stack_ffffffffffffff34;
  Transform *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  Float startTime;
  float in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  AnimatedTransform *in_stack_ffffffffffffff50;
  undefined1 local_94 [128];
  float local_14;
  Point3<float> *local_10;
  
  startTime = (Float)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  local_10 = in_RSI;
  AnimatedTransform::AnimatedTransform
            ((AnimatedTransform *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
  Transform::Transform(in_stack_fffffffffffff9d0);
  iVar2 = *(int *)(Options + 0x10);
  if (iVar2 == 0) {
    local_14 = (local_10[0x15].super_Tuple3<pbrt::Point3,_float>.y +
               local_10[0x15].super_Tuple3<pbrt::Point3,_float>.z) / 2.0;
    AnimatedTransform::Interpolate(in_stack_fffffffffffffd10,in_stack_fffffffffffffd0c);
    memcpy(in_RDI[5].m.m[3] + 2,local_94,0x80);
  }
  else if (iVar2 == 1) {
    Point3<float>::Point3(local_10,in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8,0.0);
    auVar4 = (undefined1  [56])0x0;
    PVar5 = AnimatedTransform::operator()
                      (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa94
                      );
    in_stack_ffffffffffffff48 = PVar5.super_Tuple3<pbrt::Point3,_float>.z;
    auVar3._0_8_ = PVar5.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar3._8_56_ = auVar4;
    uVar1 = vmovlpd_avx(auVar3._0_16_);
    startTime = (Float)((ulong)uVar1 >> 0x20);
    Vector3<float>::Vector3<float>
              ((Vector3<float> *)local_10,
               (Point3<float> *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
    Translate((Vector3f *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
    memcpy(in_RDI[5].m.m[3] + 2,local_140,0x80);
  }
  else {
    if (iVar2 != 2) {
      LogFatal(in_stack_fffffffffffffa84,in_stack_fffffffffffffa78,in_stack_fffffffffffffa74,
               in_stack_fffffffffffffa68);
    }
    memset(local_1cc,0,0x80);
    Transform::Transform(in_stack_fffffffffffff9d0);
    memcpy(in_RDI[5].m.m[3] + 2,local_1cc,0x80);
  }
  Inverse(in_RDI);
  Transform::operator*(in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
  Transform::operator*(in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
  AnimatedTransform::AnimatedTransform
            (in_stack_ffffffffffffff50,
             (Transform *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),startTime,
             in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
  memcpy(in_RDI,local_610,0x2b8);
  return;
}

Assistant:

CameraTransform::CameraTransform(const AnimatedTransform &worldFromCamera) {
    switch (Options->renderingSpace) {
    case RenderingCoordinateSystem::Camera: {
        // Compute _worldFromRender_ for camera-space rendering
        Float tMid = (worldFromCamera.startTime + worldFromCamera.endTime) / 2;
        worldFromRender = worldFromCamera.Interpolate(tMid);
        break;
    }
    case RenderingCoordinateSystem::CameraWorld: {
        // Compute _worldFromRender_ for camera-world space rendering
        Float tMid = (worldFromCamera.startTime + worldFromCamera.endTime) / 2;
        Point3f pCamera = worldFromCamera(Point3f(0, 0, 0), tMid);
        worldFromRender = Translate(Vector3f(pCamera));
        break;
    }
    case RenderingCoordinateSystem::World: {
        // Compute _worldFromRender_ for world-space rendering
        worldFromRender = Transform();
        break;
    }
    default:
        LOG_FATAL("Unhandled rendering coordinate space");
    }
    // Compute _renderFromCamera_ transformation
    Transform renderFromWorld = Inverse(worldFromRender);
    Transform rfc[2] = {renderFromWorld * worldFromCamera.startTransform,
                        renderFromWorld * worldFromCamera.endTransform};
    renderFromCamera = AnimatedTransform(rfc[0], worldFromCamera.startTime, rfc[1],
                                         worldFromCamera.endTime);
}